

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalhandler.cc
# Opt level: O3

void google::anon_unknown_0::InvokeDefaultSignalHandler(int signal_number)

{
  __pid_t __pid;
  sigaction sig_action;
  _union_1457 local_b0;
  sigset_t local_a8;
  
  memset(&local_b0,0,0x98);
  sigemptyset(&local_a8);
  local_b0.sa_handler = (__sighandler_t)0x0;
  sigaction(signal_number,(sigaction *)&local_b0,(sigaction *)0x0);
  __pid = getpid();
  kill(__pid,signal_number);
  return;
}

Assistant:

void InvokeDefaultSignalHandler(int signal_number) {
#ifdef HAVE_SIGACTION
  struct sigaction sig_action;
  memset(&sig_action, 0, sizeof(sig_action));
  sigemptyset(&sig_action.sa_mask);
  sig_action.sa_handler = SIG_DFL;
  sigaction(signal_number, &sig_action, NULL);
  kill(getpid(), signal_number);
#elif defined(OS_WINDOWS)
  signal(signal_number, SIG_DFL);
  raise(signal_number);
#endif
}